

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

int LogLuvEncodeStrip(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  int iVar1;
  uint uVar2;
  tmsize_t tVar3;
  long lVar4;
  bool bVar5;
  
  tVar3 = TIFFScanlineSize(tif);
  if (tVar3 == 0) {
    uVar2 = 0;
  }
  else {
    if (cc % tVar3 != 0) {
      __assert_fail("cc % rowlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                    ,0x2d1,"int LogLuvEncodeStrip(TIFF *, uint8_t *, tmsize_t, uint16_t)");
    }
    if (cc == 0) {
      uVar2 = 1;
    }
    else {
      lVar4 = 0;
      do {
        iVar1 = (*tif->tif_encoderow)(tif,bp + lVar4,tVar3,s);
        if (iVar1 != 1) break;
        bVar5 = cc - tVar3 != lVar4;
        lVar4 = tVar3 + lVar4;
      } while (bVar5);
      uVar2 = (uint)(iVar1 == 1);
    }
  }
  return uVar2;
}

Assistant:

static int LogLuvEncodeStrip(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    tmsize_t rowlen = TIFFScanlineSize(tif);

    if (rowlen == 0)
        return 0;

    assert(cc % rowlen == 0);
    while (cc && (*tif->tif_encoderow)(tif, bp, rowlen, s) == 1)
    {
        bp += rowlen;
        cc -= rowlen;
    }
    return (cc == 0);
}